

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void gflags::anon_unknown_2::RegisterCommandLineFlag
               (char *name,char *help,char *filename,FlagValue *current,FlagValue *defvalue)

{
  size_t *psVar1;
  _Rb_tree_header *__x;
  _Base_ptr p_Var2;
  _Base_ptr __y;
  ulong uVar3;
  FlagRegistry *pFVar4;
  uint uVar5;
  int iVar6;
  _Base_ptr p_Var7;
  FlagRegistry *pFVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  iterator iVar11;
  _Base_ptr p_Var12;
  iterator iVar13;
  uint uVar14;
  _Base_ptr *pp_Var15;
  _Base_ptr p_Var16;
  char *format;
  bool bVar17;
  
  p_Var12 = (_Base_ptr)0x13d622;
  if (help != (char *)0x0) {
    p_Var12 = (_Base_ptr)help;
  }
  p_Var7 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var7 = name;
  p_Var7->_M_parent = p_Var12;
  p_Var7->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var7->_M_right = 0;
  *(FlagValue **)(p_Var7 + 1) = defvalue;
  p_Var7[1]._M_parent = (_Base_ptr)current;
  p_Var7[1]._M_left = (_Base_ptr)0x0;
  pFVar8 = FlagRegistry::GlobalRegistry();
  gflags_mutex_namespace::Mutex::Lock(&pFVar8->lock_);
  p_Var9 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var9 + 1) = name;
  p_Var9[1]._M_parent = p_Var7;
  p_Var12 = &(pFVar8->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar14 = 1;
  p_Var16 = p_Var12;
  pFVar4 = pFVar8;
  while (p_Var2 = (pFVar4->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
        p_Var2 != (_Base_ptr)0x0) {
    uVar5 = strcmp(name,*(char **)(p_Var2 + 1));
    uVar14 = uVar5 >> 0x1f;
    pFVar4 = (FlagRegistry *)(&p_Var2->_M_color + (ulong)(~uVar5 >> 0x1f) * 2);
    p_Var16 = p_Var2;
  }
  p_Var10 = p_Var16;
  if (uVar14 == 0) {
LAB_00134b37:
    iVar6 = strcmp(*(char **)(p_Var10 + 1),name);
    if (iVar6 < 0) goto LAB_00134b47;
    operator_delete(p_Var9);
    p_Var12 = (p_Var10[1]._M_parent)->_M_left;
    p_Var16 = p_Var7->_M_left;
    iVar6 = strcmp((char *)p_Var12,(char *)p_Var16);
    if (iVar6 == 0) {
      format = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var12 = p_Var16;
    }
    else {
      format = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    ReportError(DIE,format,*(undefined8 *)p_Var7,p_Var12,p_Var16);
  }
  else {
    if (p_Var16 != (pFVar8->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var16);
      goto LAB_00134b37;
    }
LAB_00134b47:
    if (p_Var12 == p_Var16) {
      bVar17 = true;
    }
    else {
      iVar6 = strcmp(name,*(char **)(p_Var16 + 1));
      bVar17 = SUB41((uint)iVar6 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar17,p_Var9,p_Var16,p_Var12);
    psVar1 = &(pFVar8->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
  }
  __y = p_Var7[1]._M_parent;
  __x = &(pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  iVar11 = std::
           _Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
           ::_M_lower_bound((_Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
                             *)(pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent,(_Link_type)__x,__y,(void **)p_Var12);
  iVar13 = iVar11;
  if (((_Rb_tree_header *)iVar11._M_node != __x) &&
     (*(ulong *)(iVar11._M_node + 1) <= *(ulong *)__y)) goto LAB_00134d3c;
  p_Var9 = (_Rb_tree_node_base *)operator_new(0x30);
  uVar3 = *(ulong *)__y;
  p_Var9[1]._M_parent = (_Base_ptr)0x0;
  *(ulong *)(p_Var9 + 1) = uVar3;
  if ((_Rb_tree_header *)iVar11._M_node == __x) {
    if (((pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (iVar11._M_node =
             (pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       uVar3 <= *(ulong *)(iVar11._M_node + 1))) {
LAB_00134ca7:
      bVar17 = true;
      pp_Var15 = &(pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      iVar11._M_node = &__x->_M_header;
      while (p_Var12 = *pp_Var15, p_Var12 != (_Base_ptr)0x0) {
        bVar17 = uVar3 < *(ulong *)(p_Var12 + 1);
        iVar11._M_node = p_Var12;
        pp_Var15 = (_Base_ptr *)((long)p_Var12 + 0x20 + -0x10 + (ulong)!bVar17 * 8);
      }
      iVar13._M_node = iVar11._M_node;
      if (bVar17) {
        if (iVar11._M_node ==
            (pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
        goto LAB_00134cf4;
        iVar13._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar11._M_node);
      }
      if (uVar3 <= *(ulong *)(iVar13._M_node + 1)) {
LAB_00134d31:
        operator_delete(p_Var9);
        goto LAB_00134d3c;
      }
    }
LAB_00134cf4:
    iVar13._M_node = (_Base_ptr)0x0;
  }
  else if (uVar3 < *(ulong *)(iVar11._M_node + 1)) {
    iVar13._M_node = (pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = iVar13._M_node;
    if (iVar13._M_node == iVar11._M_node) {
LAB_00134cfa:
      iVar11._M_node = p_Var12;
      if (p_Var12 == (_Base_ptr)0x0) goto LAB_00134d31;
    }
    else {
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(iVar11._M_node);
      if (uVar3 <= *(ulong *)(p_Var10 + 1)) goto LAB_00134ca7;
      iVar13 = iVar11;
      if (p_Var10->_M_right == (_Base_ptr)0x0) {
        iVar13._M_node = (_Base_ptr)0x0;
        iVar11._M_node = p_Var10;
      }
    }
  }
  else {
    if (uVar3 <= *(ulong *)(iVar11._M_node + 1)) goto LAB_00134d31;
    p_Var12 = (pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var12 == iVar11._M_node) {
      iVar13._M_node = (_Base_ptr)0x0;
      goto LAB_00134cfa;
    }
    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(iVar11._M_node);
    if (*(ulong *)(p_Var12 + 1) <= uVar3) goto LAB_00134ca7;
    iVar13._M_node = (iVar11._M_node)->_M_right;
    if ((iVar11._M_node)->_M_right != (_Base_ptr)0x0) {
      iVar13._M_node = p_Var12;
      iVar11._M_node = p_Var12;
    }
  }
  bVar17 = true;
  if ((iVar13._M_node == (_Base_ptr)0x0) && (__x != (_Rb_tree_header *)iVar11._M_node)) {
    bVar17 = uVar3 < *(ulong *)(iVar11._M_node + 1);
  }
  std::_Rb_tree_insert_and_rebalance(bVar17,p_Var9,iVar11._M_node,&__x->_M_header);
  psVar1 = &(pFVar8->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar1 = *psVar1 + 1;
  iVar13._M_node = p_Var9;
LAB_00134d3c:
  iVar13._M_node[1]._M_parent = p_Var7;
  gflags_mutex_namespace::Mutex::Unlock(&pFVar8->lock_);
  return;
}

Assistant:

void RegisterCommandLineFlag(const char* name,
                             const char* help,
                             const char* filename,
                             FlagValue* current,
                             FlagValue* defvalue) {
  if (help == NULL)
    help = "";
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag =
      new CommandLineFlag(name, help, filename, current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);  // default registry
}